

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCDecoder.cpp
# Opt level: O3

int32_t __thiscall gnilk::IPCBinaryDecoder::ReadStr(IPCBinaryDecoder *this,string *outValue)

{
  int iVar1;
  ulong in_RAX;
  uint uVar2;
  uint8_t ch;
  uint16_t len;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX & 0xffffffffffff;
  (*(this->super_IPCDecoderBase).super_IPCReader._vptr_IPCReader[10])(this,(long)&uStack_28 + 6);
  if (uStack_28._6_2_ == 0) {
    iVar1 = 2;
  }
  else {
    uVar2 = 0;
    do {
      (*(this->super_IPCDecoderBase).super_IPCReader._vptr_IPCReader[9])(this,(long)&uStack_28 + 5);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (outValue,uStack_28._5_1_);
      uVar2 = uVar2 + 1;
    } while (uVar2 < uStack_28._6_2_);
    iVar1 = uStack_28._6_2_ + 2;
  }
  return iVar1;
}

Assistant:

int32_t IPCBinaryDecoder::ReadStr(std::string &outValue) {
    uint16_t len = 0;
    ReadU16(len);
    for (int i = 0; i < len; i++) {
        uint8_t ch;
        ReadU8(ch);
        outValue += (char) ch;
    }
    return 2 + len;
}